

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcReinforcingMesh::~IfcReinforcingMesh(IfcReinforcingMesh *this)

{
  IfcElement *this_00;
  long *plVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
                              super_IfcBuildingElement.super_IfcElement.super_IfcProduct.
                              super_IfcObject + -0x18);
  this_00 = (IfcElement *)
            ((long)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
                    super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.
                    field_0x0 + lVar2);
  plVar1 = (long *)(&(this->super_IfcReinforcingElement).field_0x178 + lVar2);
  plVar1[-0x2f] = 0x8a0a60;
  plVar1[0xf] = 0x8a0ba0;
  plVar1[-0x1e] = 0x8a0a88;
  plVar1[-0x1c] = 0x8a0ab0;
  plVar1[-0x15] = 0x8a0ad8;
  plVar1[-0xf] = 0x8a0b00;
  plVar1[-8] = 0x8a0b28;
  plVar1[-6] = 0x8a0b50;
  plVar1[-4] = 0x8a0b78;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  IfcElement::~IfcElement(this_00,&PTR_construction_vtable_24__008a0828);
  operator_delete(this_00,0x208);
  return;
}

Assistant:

IfcReinforcingMesh() : Object("IfcReinforcingMesh") {}